

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputTypeBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  Node *pNVar3;
  StorageQualifier *pSVar4;
  InterpolationQualifier *this;
  TestCaseGroup *pTVar5;
  ArrayElement *pAVar6;
  int iVar7;
  TestCaseGroup *blockGroup_8;
  SharedPtr arrayElem_1;
  TestCaseGroup *blockGroup_7;
  SharedPtr structMbr;
  TestCaseGroup *blockGroup_6;
  TestCaseGroup *blockGroup_5;
  SharedPtr arrayElem;
  SharedPtr patchOutput;
  TestCaseGroup *blockGroup_4;
  SharedPtr arrayElement_1;
  TestCaseGroup *blockGroup_3;
  int expansionLevel_1;
  int typeExpansionReducement_1;
  TestCaseGroup *blockGroup_2;
  SharedPtr structMember;
  int expansionLevel;
  int typeExpansionReducement;
  TestCaseGroup *blockGroup_1;
  SharedPtr arrayElement;
  TestCaseGroup *blockGroup;
  undefined1 local_70 [8];
  SharedPtr flatShading;
  int interfaceBlockExpansionReducement;
  ShaderType lastStage;
  undefined1 local_38 [8];
  SharedPtr output;
  bool inDefaultBlock;
  deUint32 presentShadersMask_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  output.m_state._4_4_ = presentShadersMask;
  pNVar3 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar3);
  output.m_state._3_1_ = NVar1 == TYPE_DEFAULT_BLOCK;
  if ((bool)output.m_state._3_1_) {
    pSVar4 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar4,parentStructure,STORAGE_OUT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_38,(Node *)pSVar4);
  }
  else {
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_38,parentStructure);
  }
  SVar2 = getShaderMaskLastStage(output.m_state._4_4_);
  flatShading.m_state._4_4_ = (uint)(((output.m_state._3_1_ ^ 0xff) & 1) != 0);
  if ((((SVar2 == SHADERTYPE_VERTEX) || (SVar2 == SHADERTYPE_GEOMETRY)) ||
      (SVar2 == SHADERTYPE_TESSELLATION_EVALUATION)) || ((output.m_state._3_1_ & 1) == 0)) {
    this = (InterpolationQualifier *)operator_new(0x28);
    blockGroup._4_4_ = 1;
    ResourceDefinition::InterpolationQualifier::InterpolationQualifier
              (this,(SharedPtr *)local_38,(Interpolation *)((long)&blockGroup + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_70,(Node *)this);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"basic_type","Basic types");
    arrayElement.m_state = (SharedPtrStateBase *)pTVar5;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)local_70,(TestCaseGroup *)arrayElement.m_state,true,
               2 - flatShading.m_state._4_4_);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_70,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_1,(Node *)pAVar6);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"array","Array types");
    structMember.m_state._4_4_ = (uint)(SVar2 != SHADERTYPE_VERTEX);
    structMember.m_state._0_4_ = 2 - (flatShading.m_state._4_4_ + structMember.m_state._4_4_);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_1,(TestCaseGroup *)pTVar5,true,
               (int)structMember.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_1);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar3,(SharedPtr *)local_70);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_2,pNVar3);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"struct","Struct types");
    iVar7 = flatShading.m_state._4_4_ + (SVar2 != SHADERTYPE_VERTEX);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_2,(TestCaseGroup *)pTVar5,true,2 - iVar7);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_70);
  }
  else if (SVar2 == SHADERTYPE_FRAGMENT) {
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"basic_type","Basic types");
    arrayElement_1.m_state = (SharedPtrStateBase *)pTVar5;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)local_38,(TestCaseGroup *)arrayElement_1.m_state,false,2);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_38,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_4,(Node *)pAVar6);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"array","Array types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_4,(TestCaseGroup *)pTVar5,false,2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_4);
  }
  else if (SVar2 == SHADERTYPE_TESSELLATION_CONTROL) {
    pSVar4 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar4,parentStructure,STORAGE_PATCH_OUT)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem.m_state,(Node *)pSVar4);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_38,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_5,(Node *)pAVar6);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"basic_type","Basic types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_5,(TestCaseGroup *)pTVar5,true,2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_5);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"patch_var","Basic types, per-patch");
    structMbr.m_state = (SharedPtrStateBase *)pTVar5;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&arrayElem.m_state,(TestCaseGroup *)structMbr.m_state,true,1);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember
              ((StructMember *)pNVar3,(SharedPtr *)&arrayElem.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_7,pNVar3);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"patch_var_struct","Struct types, per-patch");
    arrayElem_1.m_state = (SharedPtrStateBase *)pTVar5;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_7,(TestCaseGroup *)arrayElem_1.m_state,true,1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_7);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)&arrayElem.m_state,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup_8,(Node *)pAVar6);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar5,context,"patch_var_array","Array types, per-patch");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar5);
    generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
              (context,(SharedPtr *)&blockGroup_8,(TestCaseGroup *)pTVar5,true,1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup_8);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem.m_state);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateProgramOutputTypeBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock						= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output								= (inDefaultBlock)
																						? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																						: (parentStructure);
	const glu::ShaderType						lastStage							= getShaderMaskLastStage(presentShadersMask);
	const int									interfaceBlockExpansionReducement	= (!inDefaultBlock) ? (1) : (0); // lesser expansions on block members to keep test counts reasonable

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr flatShading(new ResourceDefinition::InterpolationQualifier(output, glu::INTERPOLATION_FLAT));

		// Only basic types, arrays of basic types, struct of basic types (and no booleans)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, flatShading, blockGroup, true, 2 - interfaceBlockExpansionReducement);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement			(new ResourceDefinition::ArrayElement(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "array", "Array types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, true, expansionLevel);
		}
		{
			const ResourceDefinition::Node::SharedPtr	structMember			(new ResourceDefinition::StructMember(flatShading));
			tcu::TestCaseGroup* const					blockGroup				= new TestCaseGroup(context, "struct", "Struct types");
			const int									typeExpansionReducement	= (lastStage != glu::SHADERTYPE_VERTEX) ? (1) : (0); // lesser expansions on other stages
			const int									expansionLevel			= 2 - interfaceBlockExpansionReducement - typeExpansionReducement;

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMember, blockGroup, true, expansionLevel);
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// only basic type and basic type array (and no booleans or matrices)
		{
			tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "basic_type", "Basic types");
			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, output, blockGroup, false, 2);
		}
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(output));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "array", "Array types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElement, blockGroup, false, 2);
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "basic_type", "Basic types");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 2);
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var", "Basic types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, patchOutput, blockGroup, true, 1);
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMbr		(new ResourceDefinition::StructMember(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_struct", "Struct types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, structMbr, blockGroup, true, 1);
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElem		(new ResourceDefinition::ArrayElement(patchOutput));
			tcu::TestCaseGroup* const					blockGroup		= new TestCaseGroup(context, "patch_var_array", "Array types, per-patch");

			targetGroup->addChild(blockGroup);
			generateProgramInputOutputTypeBasicTypeCases<PROGRAMINTERFACE_PROGRAM_OUTPUT>(context, arrayElem, blockGroup, true, 1);
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}